

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O2

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fwrite("Failed to initialize GLFW\n",0x1a,1,_stderr);
  }
  else {
    glfwWindowHint(0x2100d,4);
    handle = glfwCreateWindow(500,500,"Split view demo",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetFramebufferSizeCallback(handle,framebufferSizeFun);
      glfwSetWindowRefreshCallback(handle,windowRefreshFun);
      glfwSetCursorPosCallback(handle,cursorPosFun);
      glfwSetMouseButtonCallback(handle,mouseButtonFun);
      glfwSetKeyCallback(handle,key_callback);
      glfwMakeContextCurrent(handle);
      glfwSwapInterval(1);
      iVar1 = glfwExtensionSupported("GL_ARB_multisample");
      if (((iVar1 != 0) || (iVar1 = glfwGetWindowAttrib(handle,0x22002), 1 < iVar1)) ||
         (iVar1 = glfwGetWindowAttrib(handle,0x22003), 2 < iVar1)) {
        glEnable(0x809d);
      }
      glfwGetFramebufferSize(handle,&width,&height);
      iVar1 = 1;
      if (1 < height) {
        iVar1 = height;
      }
      do_redraw = '\0';
      height = iVar1;
      do {
        windowRefreshFun(handle);
        do {
          glfwWaitEvents();
          iVar1 = glfwWindowShouldClose(handle);
          if (iVar1 != 0) {
            glfwTerminate();
            exit(0);
          }
        } while (do_redraw != '\0');
      } while( true );
    }
    fwrite("Failed to open GLFW window\n",0x1b,1,_stderr);
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    // Initialise GLFW
    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    glfwWindowHint(GLFW_SAMPLES, 4);

    // Open OpenGL window
    window = glfwCreateWindow(500, 500, "Split view demo", NULL, NULL);
    if (!window)
    {
        fprintf(stderr, "Failed to open GLFW window\n");

        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // Set callback functions
    glfwSetFramebufferSizeCallback(window, framebufferSizeFun);
    glfwSetWindowRefreshCallback(window, windowRefreshFun);
    glfwSetCursorPosCallback(window, cursorPosFun);
    glfwSetMouseButtonCallback(window, mouseButtonFun);
    glfwSetKeyCallback(window, key_callback);

    // Enable vsync
    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    if (glfwExtensionSupported("GL_ARB_multisample") ||
        glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MAJOR) >= 2 ||
        glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MINOR) >= 3)
    {
        glEnable(GL_MULTISAMPLE_ARB);
    }

    glfwGetFramebufferSize(window, &width, &height);
    framebufferSizeFun(window, width, height);

    // Main loop
    for (;;)
    {
        // Only redraw if we need to
        if (do_redraw)
            windowRefreshFun(window);

        // Wait for new events
        glfwWaitEvents();

        // Check if the window should be closed
        if (glfwWindowShouldClose(window))
            break;
    }

    // Close OpenGL window and terminate GLFW
    glfwTerminate();

    exit(EXIT_SUCCESS);
}